

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_transporter.cpp
# Opt level: O3

char __thiscall lscpp::stdio_transporter::read_char(stdio_transporter *this)

{
  int __fd;
  char c;
  char local_9;
  
  read(0,&local_9,1);
  if ((this->comm_logger_).super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
      super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
      super__Optional_payload_base<lscpp::comm_logger>._M_engaged == true) {
    comm_logger::open_in((comm_logger *)this);
    __fd = fileno((FILE *)(this->comm_logger_).
                          super__Optional_base<lscpp::comm_logger,_false,_false>._M_payload.
                          super__Optional_payload<lscpp::comm_logger,_true,_false,_false>.
                          super__Optional_payload_base<lscpp::comm_logger>._M_payload._M_value.
                          cur_file_);
    write(__fd,&local_9,1);
  }
  return local_9;
}

Assistant:

char stdio_transporter::read_char() {
  char c;
  ::read(stdin_fileno, &c, 1);

  log_in_char(comm_logger_, c);

  return c;
}